

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraID
          (VClient *this,string *i_rCameraName,uint *o_rCameraID)

{
  Enum EVar1;
  VCameraInfo *pVVar2;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&local_28,&this->m_FrameMutex);
  ClientUtils::Clear(o_rCameraID);
  local_2c = Success;
  pVVar2 = GetCamera(this,i_rCameraName,&local_2c);
  EVar1 = local_2c;
  if (pVVar2 != (VCameraInfo *)0x0) {
    *o_rCameraID = pVVar2->m_CameraID;
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&local_28);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraID( const std::string & i_rCameraName, unsigned int & o_rCameraID ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Clear( o_rCameraID );

  Result::Enum GetResult = Result::Success;
  const ViconCGStream::VCameraInfo * pCamera = GetCamera( i_rCameraName, GetResult );
  if ( pCamera )
  {
    o_rCameraID = pCamera->m_CameraID;
  }
  return GetResult;
}